

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_set_format.c
# Opt level: O0

wchar_t archive_read_set_format(archive *_a,wchar_t code)

{
  int iVar1;
  undefined4 in_ESI;
  archive *in_RDI;
  archive_read *a;
  char str [10];
  wchar_t i;
  wchar_t slots;
  wchar_t r2;
  wchar_t r1;
  wchar_t local_40;
  int in_stack_ffffffffffffffc4;
  char local_2e [10];
  int local_24;
  int local_20;
  wchar_t local_1c;
  wchar_t local_18;
  char cStack_12;
  wchar_t local_4;
  
  cStack_12 = (char)((uint)in_ESI >> 0x10);
  local_4 = archive_read_support_format_by_code(in_RDI,in_stack_ffffffffffffffc4);
  if (L'\xffffffff' < local_4) {
    local_1c = L'\0';
    local_18 = L'\0';
    if (in_RDI[0x15].archive_format_name != (char *)0x0) {
      local_1c = L'\xffffffec';
    }
    if (cStack_12 == '\x01') {
      strcpy(local_2e,"cpio");
    }
    else if (cStack_12 == '\x03') {
      strcpy(local_2e,"tar");
    }
    else if (cStack_12 == '\x04') {
      strcpy(local_2e,"iso9660");
    }
    else if (cStack_12 == '\x05') {
      strcpy(local_2e,"zip");
    }
    else if (cStack_12 == '\a') {
      strcpy(local_2e,"ar");
    }
    else if (cStack_12 == '\b') {
      strcpy(local_2e,"mtree");
    }
    else if (cStack_12 == '\n') {
      strcpy(local_2e,"xar");
    }
    else if (cStack_12 == '\v') {
      strcpy(local_2e,"lha");
    }
    else if (cStack_12 == '\f') {
      strcpy(local_2e,"cab");
    }
    else if (cStack_12 == '\r') {
      strcpy(local_2e,"rar");
    }
    else {
      if (cStack_12 != '\x0e') {
        archive_set_error(in_RDI,0x16,"Invalid format code specified");
        return L'\xffffffe2';
      }
      strcpy(local_2e,"7zip");
    }
    local_20 = 0x10;
    in_RDI[0x15].archive_format_name = (char *)&in_RDI[8].error_string.length;
    local_24 = 0;
    while (((local_24 < local_20 && (*(long *)(in_RDI[0x15].archive_format_name + 8) != 0)) &&
           (iVar1 = strcmp(*(char **)(in_RDI[0x15].archive_format_name + 8),local_2e), iVar1 != 0)))
    {
      local_24 = local_24 + 1;
      in_RDI[0x15].archive_format_name = in_RDI[0x15].archive_format_name + 0x58;
    }
    if ((*(long *)(in_RDI[0x15].archive_format_name + 8) == 0) ||
       (iVar1 = strcmp(*(char **)(in_RDI[0x15].archive_format_name + 8),local_2e), iVar1 != 0)) {
      archive_set_error(in_RDI,0x16,"Internal error: Unable to set format");
      local_18 = L'\xffffffe2';
    }
    if (local_18 < local_1c) {
      local_40 = local_18;
    }
    else {
      local_40 = local_1c;
    }
    local_4 = local_40;
  }
  return local_4;
}

Assistant:

int
archive_read_set_format(struct archive *_a, int code)
{
  int r1, r2, slots, i;
  char str[10];
  struct archive_read *a = (struct archive_read *)_a;

  if ((r1 = archive_read_support_format_by_code(_a, code)) < (ARCHIVE_OK))
    return r1;

  r1 = r2 = (ARCHIVE_OK);
  if (a->format)
    r2 = (ARCHIVE_WARN);
  switch (code & ARCHIVE_FORMAT_BASE_MASK)
  {
    case ARCHIVE_FORMAT_7ZIP:
      strcpy(str, "7zip");
      break;
    case ARCHIVE_FORMAT_AR:
      strcpy(str, "ar");
      break;
    case ARCHIVE_FORMAT_CAB:
      strcpy(str, "cab");
      break;
    case ARCHIVE_FORMAT_CPIO:
      strcpy(str, "cpio");
      break;
    case ARCHIVE_FORMAT_ISO9660:
      strcpy(str, "iso9660");
      break;
    case ARCHIVE_FORMAT_LHA:
      strcpy(str, "lha");
      break;
    case ARCHIVE_FORMAT_MTREE:
      strcpy(str, "mtree");
      break;
    case ARCHIVE_FORMAT_RAR:
      strcpy(str, "rar");
      break;
    case ARCHIVE_FORMAT_TAR:
      strcpy(str, "tar");
      break;
    case ARCHIVE_FORMAT_XAR:
      strcpy(str, "xar");
      break;
    case ARCHIVE_FORMAT_ZIP:
      strcpy(str, "zip");
      break;
    default:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Invalid format code specified");
      return (ARCHIVE_FATAL);
  }

  slots = sizeof(a->formats) / sizeof(a->formats[0]);
  a->format = &(a->formats[0]);
  for (i = 0; i < slots; i++, a->format++) {
    if (!a->format->name || !strcmp(a->format->name, str))
      break;
  }
  if (!a->format->name || strcmp(a->format->name, str))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
        "Internal error: Unable to set format");
    r1 = (ARCHIVE_FATAL);
  }

  return (r1 < r2) ? r1 : r2;
}